

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpsinput.h
# Opt level: O1

void __thiscall soplex::MPSInput::syntaxError(MPSInput *this)

{
  long *plVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Syntax error in line ",0x15);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cerr,this->m_lineno);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  this->m_section = ENDATA;
  this->m_has_error = true;
  return;
}

Assistant:

void syntaxError()
   {
      SPX_MSG_ERROR(std::cerr << "Syntax error in line " << m_lineno << std::endl;)
      m_section = ENDATA;
      m_has_error = true;
   }